

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_object_impl.hpp
# Opt level: O0

void __thiscall
asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>::
~io_object_impl(io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
                *this)

{
  resolver_service_base *in_RDI;
  implementation_type *in_stack_ffffffffffffffe8;
  
  resolver_service_base::destroy(in_RDI,in_stack_ffffffffffffffe8);
  any_io_executor::~any_io_executor((any_io_executor *)0x708903);
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x708911);
  return;
}

Assistant:

~io_object_impl()
  {
    service_->destroy(implementation_);
  }